

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O3

MessageProcessingResult __thiscall
helics::GlobalTimeCoordinator::checkExecEntry(GlobalTimeCoordinator *this,GlobalFederateId param_1)

{
  pointer pDVar1;
  bool bVar2;
  DependencyInfo *dep;
  pointer pDVar3;
  MessageProcessingResult MVar4;
  string_view str;
  ActionMessage execgrant;
  ActionMessage local_d0;
  
  if ((this->super_BaseTimeCoordinator).checkingExec == false) {
    MVar4 = CONTINUE_PROCESSING;
    if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      ActionMessage::ActionMessage(&local_d0,cmd_log);
      local_d0.messageID = 3;
      local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      str._M_str = "calling checkExecEntry without first calling enterExec this is probably a bug";
      str._M_len = 0x4d;
      local_d0.dest_id.gid = local_d0.source_id.gid;
      ActionMessage::setString(&local_d0,0,str);
      if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,&local_d0);
      ActionMessage::~ActionMessage(&local_d0);
    }
  }
  else {
    bVar2 = TimeDependencies::checkIfReadyForExecEntry
                      (&(this->super_BaseTimeCoordinator).dependencies,false,false);
    if (!bVar2) {
      if (this->currentTimeState != exec_requested_iterative) {
        return CONTINUE_PROCESSING;
      }
      pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar1 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pDVar3 != pDVar1) {
        do {
          if (pDVar3->dependency == true) {
            if ((pDVar3->super_TimeData).minFed.gid !=
                (this->super_BaseTimeCoordinator).mSourceId.gid) {
              return CONTINUE_PROCESSING;
            }
            if ((pDVar3->super_TimeData).responseSequenceCounter !=
                (this->super_BaseTimeCoordinator).sequenceCounter) {
              return CONTINUE_PROCESSING;
            }
          }
          pDVar3 = pDVar3 + 1;
        } while (pDVar3 != pDVar1);
      }
    }
    (this->super_BaseTimeCoordinator).executionMode = true;
    (this->currentMinTime).internalTimeCode = 0;
    this->currentTimeState = time_granted;
    (this->nextEvent).internalTimeCode = 0;
    ActionMessage::ActionMessage(&local_d0,cmd_exec_grant);
    local_d0.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
    transmitTimingMessagesDownstream(this,&local_d0,(GlobalFederateId)0x8831d580);
    transmitTimingMessagesUpstream(this,&local_d0);
    ActionMessage::~ActionMessage(&local_d0);
    MVar4 = NEXT_STEP;
  }
  return MVar4;
}

Assistant:

MessageProcessingResult GlobalTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    if (!checkingExec) {
        if (sendMessageFunction) {
            ActionMessage logcmd(CMD_LOG);
            logcmd.messageID = HELICS_LOG_LEVEL_WARNING;
            logcmd.dest_id = mSourceId;
            logcmd.source_id = mSourceId;
            logcmd.setString(
                0, "calling checkExecEntry without first calling enterExec this is probably a bug");
            sendMessageFunction(logcmd);
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (currentTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (const auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}